

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

size_t write_vars(MIR_context_t ctx,writer_func_t writer,MIR_func_t func,VARR_MIR_var_t *vars,
                 size_t start,size_t vars_num,char *prefix)

{
  size_t *psVar1;
  int iVar2;
  MIR_var_t *pMVar3;
  reduce_data *data;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  reg_desc_t *prVar8;
  ulong uVar9;
  long extraout_RDX;
  uint8_t uVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  MIR_context_t ctx_00;
  MIR_context_t unaff_R12;
  ulong uVar14;
  ulong uVar15;
  MIR_str_t str;
  MIR_str_t str_00;
  MIR_str_t str_01;
  MIR_context_t local_58;
  MIR_func_t func_00;
  
  if (vars == (VARR_MIR_var_t *)0x0 || vars_num == 0) {
    sVar5 = 0;
  }
  else {
    lVar12 = start * 0x18 + 8;
    bVar4 = false;
    local_58 = (MIR_context_t)0x0;
    do {
      pMVar3 = vars->varr;
      if ((pMVar3 == (MIR_var_t *)0x0) || (vars->els_num <= start)) {
        write_vars_cold_1();
        ctx = (MIR_context_t)writer;
LAB_00143b21:
        pcVar13 = "undeclared func reg %s";
        ctx_00 = (MIR_context_t)0xf;
        (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared func reg %s",unaff_R12);
        if ((writer_func_t)pcVar13 == (writer_func_t)0x0) {
          sVar5 = 0;
        }
        else {
          uVar14 = *(ulong *)(extraout_RDX + 0x30);
          uVar15 = 0;
          uVar9 = uVar14;
          if (0x7f < uVar14) {
            do {
              uVar15 = uVar15 + 1;
              bVar4 = 0xff < uVar9;
              uVar9 = uVar9 >> 8;
            } while (bVar4);
          }
          if (4 < uVar15) {
            __assert_fail("nb <= 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
          }
          uVar15 = uVar15 + (uVar15 == 0);
          uVar10 = (char)uVar15 + '\x1f';
          data = ctx_00->io_ctx->io_reduce_data;
          uVar11 = data->buf_bound;
          if ((ulong)uVar11 < 0x40000) {
            data->buf_bound = uVar11 + 1;
            data->buf[uVar11] = uVar10;
          }
          else {
            _reduce_encode_buf(data);
            data->buf_bound = 1;
            data->buf[0] = uVar10;
          }
          uVar9 = uVar15 & 0xffffffff;
          do {
            put_byte(ctx_00,(writer_func_t)pcVar13,(uint)uVar14 & 0xff);
            uVar14 = uVar14 >> 8;
            uVar11 = (int)uVar9 - 1;
            uVar9 = (ulong)uVar11;
          } while (uVar11 != 0);
          sVar5 = uVar15 + 1;
          psVar1 = &ctx_00->io_ctx->output_labs_len;
          *psVar1 = *psVar1 + sVar5;
        }
        return sVar5;
      }
      iVar2 = *(int *)((long)pMVar3 + lVar12 + -8);
      unaff_R12 = *(MIR_context_t *)((long)&pMVar3->type + lVar12);
      if (!bVar4) {
        sVar6 = strlen(prefix);
        str.s = prefix;
        str.len = sVar6 + 1;
        sVar5 = write_str_tag(ctx,writer,str,TAG_NAME1);
        local_58 = (MIR_context_t)((long)&local_58->gen_ctx + sVar5);
      }
      sVar5 = put_byte(ctx,writer,iVar2 + 0x2b);
      sVar6 = strlen((char *)unaff_R12);
      str_00.s = (char *)unaff_R12;
      str_00.len = sVar6 + 1;
      sVar7 = write_str_tag(ctx,writer,str_00,TAG_NAME1);
      prVar8 = find_rd_by_name(unaff_R12,(char *)func,func_00);
      if (prVar8 == (reg_desc_t *)0x0) goto LAB_00143b21;
      unaff_R12 = (MIR_context_t)((long)&local_58->gen_ctx + sVar7 + sVar5);
      prVar8 = find_rd_by_reg(ctx,prVar8->reg,func);
      pcVar13 = prVar8->hard_reg_name;
      if (pcVar13 != (char *)0x0) {
        sVar6 = strlen(pcVar13);
        str_01.s = pcVar13;
        str_01.len = sVar6 + 1;
        sVar5 = write_str_tag(ctx,writer,str_01,TAG_NAME1);
        unaff_R12 = (MIR_context_t)((long)&unaff_R12->gen_ctx + sVar5);
      }
      lVar12 = lVar12 + 0x18;
      start = start + 1;
      vars_num = vars_num - 1;
      bVar4 = true;
      local_58 = unaff_R12;
    } while (vars_num != 0);
    sVar5 = put_byte(ctx,writer,0x3d);
    sVar5 = (long)&unaff_R12->gen_ctx + sVar5;
  }
  return sVar5;
}

Assistant:

static size_t write_vars (MIR_context_t ctx, writer_func_t writer, MIR_func_t func,
                          VARR (MIR_var_t) * vars, size_t start, size_t vars_num,
                          const char *prefix) {
  if (vars_num == 0 || vars == NULL) return 0;
  size_t len = 0;
  int first_p = TRUE;
  for (size_t i = 0; i < vars_num; i++) {
    MIR_var_t var = VARR_GET (MIR_var_t, vars, i + start);
    if (first_p) len += write_name (ctx, writer, prefix);
    first_p = FALSE;
    len += write_type (ctx, writer, var.type);
    len += write_name (ctx, writer, var.name);
    MIR_reg_t reg = MIR_reg (ctx, var.name, func);
    const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg, func);
    if (hard_reg_name != NULL) len += write_name (ctx, writer, hard_reg_name);
  }
  len += put_byte (ctx, writer, TAG_EOI);
  return len;
}